

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

Expression * __thiscall
wasm::TranslateToFuzzReader::buildIf(TranslateToFuzzReader *this,ThreeArgs *args,Type type)

{
  Expression *condition;
  Expression *ifTrue;
  Expression *ifFalse;
  If *pIVar1;
  optional<wasm::Type> type_00;
  optional<wasm::Type> local_30;
  ThreeArgs *local_20;
  ThreeArgs *args_local;
  TranslateToFuzzReader *this_local;
  Type type_local;
  
  condition = args->a;
  ifTrue = args->b;
  ifFalse = args->c;
  local_20 = args;
  args_local = (ThreeArgs *)this;
  this_local = (TranslateToFuzzReader *)type.id;
  std::optional<wasm::Type>::optional<wasm::Type_&,_true>(&local_30,(Type *)&this_local);
  type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._9_7_ = 0;
  type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload =
       local_30.super__Optional_base<wasm::Type,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::Type>._M_payload;
  type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_engaged =
       local_30.super__Optional_base<wasm::Type,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::Type>._M_engaged;
  pIVar1 = Builder::makeIf(&this->builder,condition,ifTrue,ifFalse,type_00);
  return (Expression *)pIVar1;
}

Assistant:

Expression* TranslateToFuzzReader::buildIf(const struct ThreeArgs& args,
                                           Type type) {
  return builder.makeIf(args.a, args.b, args.c, type);
}